

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O2

void sga_pack_unpack(Integer g_src,Integer g_dst,Integer g_msk,Integer lo,Integer hi,Integer *icount
                    ,Integer pack)

{
  undefined8 *puVar1;
  long *plVar2;
  float fVar3;
  double dVar4;
  undefined8 uVar5;
  Integer nelem;
  logical lVar6;
  void *__s;
  void *pvVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  long lVar11;
  double *pdVar12;
  char *string;
  long lVar13;
  long lVar14;
  Integer IVar15;
  long lStack_f0;
  Integer np;
  Integer elems;
  void *local_d0;
  Integer hip;
  Integer lop;
  Integer local_b8;
  void *ptr;
  Integer lop_1;
  Integer local_a0;
  void *local_98;
  Integer local_90;
  Integer dst_lo;
  Integer ONE;
  Integer type_msk;
  Integer type_src;
  Integer local_68;
  Integer dst_hi;
  Integer type_dst;
  Integer ndim_msk;
  Integer ndim_dst;
  Integer ndim_src;
  Integer dims;
  
  np = 0;
  local_90 = lo;
  local_68 = hi;
  nelem = pnga_nnodes();
  local_98 = (void *)pnga_nodeid();
  pnga_check_handle(g_src,"ga_pack src");
  pnga_check_handle(g_dst,"ga_pack dst");
  pnga_check_handle(g_msk,"ga_pack msk");
  local_a0 = g_src;
  pnga_inquire(g_src,&type_src,&ndim_src,&dims);
  local_b8 = g_dst;
  pnga_inquire(g_dst,&type_dst,&ndim_dst,&dims);
  local_d0 = (void *)g_msk;
  pnga_inquire(g_msk,&type_msk,&ndim_msk,&dims);
  if (ndim_src != 1) {
    pnga_error("ga_pack: supports 1-dim arrays only: src",ndim_src);
  }
  if (ndim_dst != 1) {
    pnga_error("ga_pack: supports 1-dim arrays only: dst",ndim_dst);
  }
  IVar15 = local_90;
  if (ndim_msk != 1) {
    pnga_error("ga_pack: supports 1-dim arrays only: msk",ndim_msk);
  }
  if (type_src != CONCAT44(type_dst._4_4_,(int)type_dst)) {
    pnga_error("ga_pack: src and dst must be same type",0);
  }
  if (pack == 1) {
    lVar6 = pnga_compare_distr(local_a0,(Integer)local_d0);
    if (lVar6 == 0) {
      string = "ga_pack: src and msk distributions differ";
LAB_00142373:
      pnga_error(string,0);
    }
  }
  else {
    lVar6 = pnga_compare_distr(local_b8,(Integer)local_d0);
    if (lVar6 == 0) {
      string = "ga_unpack: dst and msk distributions differ";
      goto LAB_00142373;
    }
  }
  pnga_sync();
  __s = pnga_malloc(nelem,0x3ea,"ga_pack lim buf");
  memset(__s,0,nelem * 8);
  pnga_distribution((Integer)local_d0,(Integer)local_98,&lop,&hip);
  pvVar7 = local_d0;
  if (0 < lop) {
    lop_1 = lop + -1;
    if (lop < IVar15) {
      lop = IVar15;
    }
    if (local_68 < hip) {
      hip = local_68;
    }
    if (IVar15 <= hip && lop <= local_68) {
      ONE = 1;
      local_98 = __s;
      pnga_locate_nnodes((Integer)local_d0,&ONE,&lop_1,&np);
      pnga_access_ptr((Integer)pvVar7,&lop,&hip,&ptr,&elems);
      elems = (hip - lop) + 1;
      lStack_f0 = -1;
      lVar8 = -1;
      __s = local_98;
      IVar15 = local_90;
      switch(type_msk) {
      case 0x3e9:
        for (lVar9 = 0; lStack_f0 = lVar8, lVar9 < elems; lVar9 = lVar9 + 1) {
          if (*(int *)((long)ptr + lVar9 * 4) != 0) {
            if (lVar8 < 0) {
              lVar8 = lVar9;
            }
            plVar2 = (long *)((long)local_98 + np * 8);
            *plVar2 = *plVar2 + 1;
          }
        }
        break;
      case 0x3ea:
        for (lVar9 = 0; lStack_f0 = lVar8, lVar9 < elems; lVar9 = lVar9 + 1) {
          if (*(long *)((long)ptr + lVar9 * 8) != 0) {
            if (lVar8 < 0) {
              lVar8 = lVar9;
            }
            plVar2 = (long *)((long)local_98 + np * 8);
            *plVar2 = *plVar2 + 1;
          }
        }
        break;
      case 0x3eb:
        for (lVar9 = 0; lStack_f0 = lVar8, lVar9 < elems; lVar9 = lVar9 + 1) {
          fVar3 = *(float *)((long)ptr + lVar9 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            if (lVar8 < 0) {
              lVar8 = lVar9;
            }
            plVar2 = (long *)((long)local_98 + np * 8);
            *plVar2 = *plVar2 + 1;
          }
        }
        break;
      case 0x3ec:
        for (lVar9 = 0; lStack_f0 = lVar8, lVar9 < elems; lVar9 = lVar9 + 1) {
          dVar4 = *(double *)((long)ptr + lVar9 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            if (lVar8 < 0) {
              lVar8 = lVar9;
            }
            plVar2 = (long *)((long)local_98 + np * 8);
            *plVar2 = *plVar2 + 1;
          }
        }
        break;
      case 0x3ee:
        for (lVar9 = 0; lStack_f0 = lVar8, lVar9 < elems; lVar9 = lVar9 + 1) {
          fVar3 = *(float *)((long)ptr + lVar9 * 8);
          if (((fVar3 != 0.0) || (NAN(fVar3))) ||
             ((fVar3 = *(float *)((long)ptr + lVar9 * 8 + 4), fVar3 != 0.0 || (NAN(fVar3))))) {
            if (lVar8 < 0) {
              lVar8 = lVar9;
            }
            plVar2 = (long *)((long)local_98 + np * 8);
            *plVar2 = *plVar2 + 1;
          }
        }
        break;
      case 0x3ef:
        pdVar12 = (double *)((long)ptr + 8);
        for (lVar9 = 0; lStack_f0 = lVar8, lVar9 < elems; lVar9 = lVar9 + 1) {
          if ((((pdVar12[-1] != 0.0) || (NAN(pdVar12[-1]))) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))
             ) {
            if (lVar8 < 0) {
              lVar8 = lVar9;
            }
            plVar2 = (long *)((long)local_98 + np * 8);
            *plVar2 = *plVar2 + 1;
          }
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x3f8:
        for (lVar9 = 0; lStack_f0 = lVar8, lVar9 < elems; lVar9 = lVar9 + 1) {
          if (*(long *)((long)ptr + lVar9 * 8) != 0) {
            if (lVar8 < 0) {
              lVar8 = lVar9;
            }
            plVar2 = (long *)((long)local_98 + np * 8);
            *plVar2 = *plVar2 + 1;
          }
        }
      }
      goto switchD_00142635_caseD_3ed;
    }
  }
  lStack_f0 = -1;
switchD_00142635_caseD_3ed:
  pnga_gop(0x3ea,__s,nelem,"+");
  *icount = 0;
  lVar8 = 0;
  if (nelem < 1) {
    nelem = lVar8;
  }
  lVar11 = 0;
  for (lVar9 = 0; nelem != lVar9; lVar9 = lVar9 + 1) {
    lVar14 = *(long *)((long)__s + lVar9 * 8);
    lVar13 = 0;
    if (lVar9 < np) {
      lVar13 = lVar14;
    }
    lVar11 = lVar11 + lVar13;
    lVar8 = lVar8 + lVar14;
    *icount = lVar8;
  }
  if (((lop <= local_68) && (IVar15 <= hip)) && (lVar8 = *(long *)((long)__s + np * 8), lVar8 != 0))
  {
    elems = 0;
    pvVar7 = pnga_malloc(lVar8,(int)type_dst,"ga pack buf");
    pnga_access_ptr((Integer)local_d0,&lop,&hip,&elems,&lop_1);
    dst_lo = lVar11 + 1;
    if (pack == 1) {
      ONE = 0;
      dst_hi = lVar11 + *(long *)((long)__s + np * 8);
      local_d0 = pvVar7;
      pnga_access_ptr(local_a0,&lop,&hip,&ONE,&lop_1);
      pvVar7 = local_d0;
      lVar9 = hip - lop;
      lVar8 = *(long *)((long)__s + np * 8);
      switch(type_src * 0x11 + type_msk) {
      case 0x4662:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(int *)(elems + lStack_f0 * 4) != 0) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4663:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4664:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4665:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          dVar4 = *(double *)(elems + lStack_f0 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4666:
      case 0x4669:
      case 0x466a:
      case 0x466b:
      case 0x466c:
      case 0x466d:
      case 0x466e:
      case 0x466f:
      case 0x4670:
      case 0x4672:
      case 0x4677:
      case 0x467a:
      case 0x467b:
      case 0x467c:
      case 0x467d:
      case 0x467e:
      case 0x467f:
      case 0x4680:
      case 0x4681:
      case 0x4683:
      case 0x4688:
      case 0x468b:
      case 0x468c:
      case 0x468d:
      case 0x468e:
      case 0x468f:
      case 0x4690:
      case 0x4691:
      case 0x4692:
      case 0x4694:
      case 0x4699:
      case 0x469c:
      case 0x469d:
      case 0x469e:
      case 0x469f:
      case 0x46a0:
      case 0x46a1:
      case 0x46a2:
      case 0x46a3:
        break;
      case 0x4667:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 8);
          if (((fVar3 != 0.0) ||
              ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
             (NAN(fVar3))) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4668:
        pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if ((pdVar12[-1] != 0.0) || (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))
             ) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x4671:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4673:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(int *)(elems + lStack_f0 * 4) != 0) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4674:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4675:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4676:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          dVar4 = *(double *)(elems + lStack_f0 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4678:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 8);
          if (((fVar3 != 0.0) ||
              ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
             (NAN(fVar3))) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4679:
        pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if ((pdVar12[-1] != 0.0) || (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))
             ) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x4682:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4684:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(int *)(elems + lStack_f0 * 4) != 0) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4685:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4686:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4687:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          dVar4 = *(double *)(elems + lStack_f0 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4689:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 8);
          if (((fVar3 != 0.0) ||
              ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
             (NAN(fVar3))) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x468a:
        pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if ((pdVar12[-1] != 0.0) || (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))
             ) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x4693:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined4 *)((long)local_d0 + lVar11 * 4) = *(undefined4 *)(ONE + lStack_f0 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4695:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(int *)(elems + lStack_f0 * 4) != 0) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4696:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4697:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4698:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          dVar4 = *(double *)(elems + lStack_f0 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x469a:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 8);
          if (((fVar3 != 0.0) ||
              ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
             (NAN(fVar3))) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x469b:
        pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if ((pdVar12[-1] != 0.0) || (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))
             ) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x46a4:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      default:
        lVar11 = type_src * 0x11 + type_msk;
        switch(lVar11) {
        case 0x46b7:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(int *)(elems + lStack_f0 * 4) != 0) {
              *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46b8:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(long *)(elems + lStack_f0 * 8) != 0) {
              *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46b9:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            fVar3 = *(float *)(elems + lStack_f0 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46ba:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            dVar4 = *(double *)(elems + lStack_f0 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46bb:
        case 0x46be:
        case 0x46bf:
        case 0x46c0:
        case 0x46c1:
        case 0x46c2:
        case 0x46c3:
        case 0x46c4:
        case 0x46c5:
        case 0x46c7:
        case 0x46cc:
        case 0x46cf:
        case 0x46d0:
        case 0x46d1:
        case 0x46d2:
        case 0x46d3:
        case 0x46d4:
        case 0x46d5:
        case 0x46d6:
          break;
        case 0x46bc:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            fVar3 = *(float *)(elems + lStack_f0 * 8);
            if (((fVar3 != 0.0) ||
                ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
               (NAN(fVar3))) {
              *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46bd:
          pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if ((pdVar12[-1] != 0.0) ||
               (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))) {
              *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            pdVar12 = pdVar12 + 2;
          }
          break;
        case 0x46c6:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(long *)(elems + lStack_f0 * 8) != 0) {
              *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46c8:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(int *)(elems + lStack_f0 * 4) != 0) {
              uVar5 = puVar10[1];
              puVar1 = (undefined8 *)((long)local_d0 + lVar11 * 0x10);
              *puVar1 = *puVar10;
              puVar1[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46c9:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(long *)(elems + lStack_f0 * 8) != 0) {
              uVar5 = puVar10[1];
              puVar1 = (undefined8 *)((long)local_d0 + lVar11 * 0x10);
              *puVar1 = *puVar10;
              puVar1[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46ca:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            fVar3 = *(float *)(elems + lStack_f0 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              uVar5 = puVar10[1];
              puVar1 = (undefined8 *)((long)local_d0 + lVar11 * 0x10);
              *puVar1 = *puVar10;
              puVar1[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46cb:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            dVar4 = *(double *)(elems + lStack_f0 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              uVar5 = puVar10[1];
              puVar1 = (undefined8 *)((long)local_d0 + lVar11 * 0x10);
              *puVar1 = *puVar10;
              puVar1[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46cd:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            fVar3 = *(float *)(elems + lStack_f0 * 8);
            if (((fVar3 != 0.0) ||
                ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
               (NAN(fVar3))) {
              uVar5 = puVar10[1];
              puVar1 = (undefined8 *)((long)local_d0 + lVar11 * 0x10);
              *puVar1 = *puVar10;
              puVar1[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46ce:
          lVar11 = lStack_f0 << 4;
          lVar14 = 0;
          while ((lStack_f0 <= lVar9 && (lVar14 < lVar8))) {
            if ((*(double *)(elems + lVar11) != 0.0) ||
               (((NAN(*(double *)(elems + lVar11)) ||
                 (dVar4 = *(double *)(elems + 8 + lVar11), dVar4 != 0.0)) || (NAN(dVar4))))) {
              uVar5 = ((undefined8 *)(ONE + lVar11))[1];
              puVar10 = (undefined8 *)((long)local_d0 + lVar14 * 0x10);
              *puVar10 = *(undefined8 *)(ONE + lVar11);
              puVar10[1] = uVar5;
              lVar14 = lVar14 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            lVar11 = lVar11 + 0x10;
          }
          break;
        case 0x46d7:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(long *)(elems + lStack_f0 * 8) != 0) {
              uVar5 = puVar10[1];
              puVar1 = (undefined8 *)((long)local_d0 + lVar11 * 0x10);
              *puVar1 = *puVar10;
              puVar1[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        default:
          switch(lVar11) {
          case 0x4761:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              if (*(int *)(elems + lStack_f0 * 4) != 0) {
                *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4762:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              if (*(long *)(elems + lStack_f0 * 8) != 0) {
                *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4763:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              fVar3 = *(float *)(elems + lStack_f0 * 4);
              if ((fVar3 != 0.0) || (NAN(fVar3))) {
                *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4764:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              dVar4 = *(double *)(elems + lStack_f0 * 8);
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4766:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              fVar3 = *(float *)(elems + lStack_f0 * 8);
              if (((fVar3 != 0.0) ||
                  ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0))))
                 || (NAN(fVar3))) {
                *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4767:
            pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              if ((pdVar12[-1] != 0.0) ||
                 (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))) {
                *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
              pdVar12 = pdVar12 + 2;
            }
            break;
          case 0x4770:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              if (*(long *)(elems + lStack_f0 * 8) != 0) {
                *(undefined8 *)((long)local_d0 + lVar11 * 8) = *(undefined8 *)(ONE + lStack_f0 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
          }
        }
      }
      pnga_put(local_b8,&dst_lo,&dst_hi,local_d0,&lop_1);
      pnga_release(local_a0,&lop,&hip);
    }
    else {
      ONE = 0;
      dst_hi = lVar11 + *(long *)((long)__s + np * 8);
      pnga_access_ptr(local_b8,&lop,&hip,&ONE,&lop_1);
      pnga_get(local_a0,&dst_lo,&dst_hi,pvVar7,&lop_1);
      lVar9 = hip - lop;
      lVar8 = *(long *)((long)__s + np * 8);
      switch(type_src * 0x11 + type_msk) {
      case 0x4662:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(int *)(elems + lStack_f0 * 4) != 0) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4663:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4664:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4665:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          dVar4 = *(double *)(elems + lStack_f0 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4666:
      case 0x4669:
      case 0x466a:
      case 0x466b:
      case 0x466c:
      case 0x466d:
      case 0x466e:
      case 0x466f:
      case 0x4670:
      case 0x4672:
      case 0x4677:
      case 0x467a:
      case 0x467b:
      case 0x467c:
      case 0x467d:
      case 0x467e:
      case 0x467f:
      case 0x4680:
      case 0x4681:
      case 0x4683:
      case 0x4688:
      case 0x468b:
      case 0x468c:
      case 0x468d:
      case 0x468e:
      case 0x468f:
      case 0x4690:
      case 0x4691:
      case 0x4692:
      case 0x4694:
      case 0x4699:
      case 0x469c:
      case 0x469d:
      case 0x469e:
      case 0x469f:
      case 0x46a0:
      case 0x46a1:
      case 0x46a2:
      case 0x46a3:
        break;
      case 0x4667:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 8);
          if (((fVar3 != 0.0) ||
              ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
             (NAN(fVar3))) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4668:
        pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if ((pdVar12[-1] != 0.0) || (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))
             ) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x4671:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4673:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(int *)(elems + lStack_f0 * 4) != 0) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4674:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4675:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4676:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          dVar4 = *(double *)(elems + lStack_f0 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4678:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 8);
          if (((fVar3 != 0.0) ||
              ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
             (NAN(fVar3))) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4679:
        pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if ((pdVar12[-1] != 0.0) || (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))
             ) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x4682:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4684:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(int *)(elems + lStack_f0 * 4) != 0) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4685:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4686:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4687:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          dVar4 = *(double *)(elems + lStack_f0 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4689:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 8);
          if (((fVar3 != 0.0) ||
              ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
             (NAN(fVar3))) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x468a:
        pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if ((pdVar12[-1] != 0.0) || (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))
             ) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x4693:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined4 *)(ONE + lStack_f0 * 4) = *(undefined4 *)((long)pvVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4695:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(int *)(elems + lStack_f0 * 4) != 0) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4696:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4697:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x4698:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          dVar4 = *(double *)(elems + lStack_f0 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x469a:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          fVar3 = *(float *)(elems + lStack_f0 * 8);
          if (((fVar3 != 0.0) ||
              ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
             (NAN(fVar3))) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      case 0x469b:
        pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if ((pdVar12[-1] != 0.0) || (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))
             ) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x46a4:
        lVar11 = 0;
        while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
          if (*(long *)(elems + lStack_f0 * 8) != 0) {
            *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          }
          lStack_f0 = lStack_f0 + 1;
        }
        break;
      default:
        lVar11 = type_src * 0x11 + type_msk;
        switch(lVar11) {
        case 0x46b7:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(int *)(elems + lStack_f0 * 4) != 0) {
              *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46b8:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(long *)(elems + lStack_f0 * 8) != 0) {
              *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46b9:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            fVar3 = *(float *)(elems + lStack_f0 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46ba:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            dVar4 = *(double *)(elems + lStack_f0 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46bb:
        case 0x46be:
        case 0x46bf:
        case 0x46c0:
        case 0x46c1:
        case 0x46c2:
        case 0x46c3:
        case 0x46c4:
        case 0x46c5:
        case 0x46c7:
        case 0x46cc:
        case 0x46cf:
        case 0x46d0:
        case 0x46d1:
        case 0x46d2:
        case 0x46d3:
        case 0x46d4:
        case 0x46d5:
        case 0x46d6:
          break;
        case 0x46bc:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            fVar3 = *(float *)(elems + lStack_f0 * 8);
            if (((fVar3 != 0.0) ||
                ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
               (NAN(fVar3))) {
              *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46bd:
          pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if ((pdVar12[-1] != 0.0) ||
               (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))) {
              *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            pdVar12 = pdVar12 + 2;
          }
          break;
        case 0x46c6:
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(long *)(elems + lStack_f0 * 8) != 0) {
              *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
          }
          break;
        case 0x46c8:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(int *)(elems + lStack_f0 * 4) != 0) {
              puVar1 = (undefined8 *)((long)pvVar7 + lVar11 * 0x10);
              uVar5 = puVar1[1];
              *puVar10 = *puVar1;
              puVar10[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46c9:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(long *)(elems + lStack_f0 * 8) != 0) {
              puVar1 = (undefined8 *)((long)pvVar7 + lVar11 * 0x10);
              uVar5 = puVar1[1];
              *puVar10 = *puVar1;
              puVar10[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46ca:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            fVar3 = *(float *)(elems + lStack_f0 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              puVar1 = (undefined8 *)((long)pvVar7 + lVar11 * 0x10);
              uVar5 = puVar1[1];
              *puVar10 = *puVar1;
              puVar10[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46cb:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            dVar4 = *(double *)(elems + lStack_f0 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              puVar1 = (undefined8 *)((long)pvVar7 + lVar11 * 0x10);
              uVar5 = puVar1[1];
              *puVar10 = *puVar1;
              puVar10[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46cd:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            fVar3 = *(float *)(elems + lStack_f0 * 8);
            if (((fVar3 != 0.0) ||
                ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0)))) ||
               (NAN(fVar3))) {
              puVar1 = (undefined8 *)((long)pvVar7 + lVar11 * 0x10);
              uVar5 = puVar1[1];
              *puVar10 = *puVar1;
              puVar10[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        case 0x46ce:
          lVar11 = lStack_f0 << 4;
          lVar14 = 0;
          while ((lStack_f0 <= lVar9 && (lVar14 < lVar8))) {
            if ((*(double *)(elems + lVar11) != 0.0) ||
               (((NAN(*(double *)(elems + lVar11)) ||
                 (dVar4 = *(double *)(elems + 8 + lVar11), dVar4 != 0.0)) || (NAN(dVar4))))) {
              puVar10 = (undefined8 *)((long)pvVar7 + lVar14 * 0x10);
              uVar5 = puVar10[1];
              *(undefined8 *)(ONE + lVar11) = *puVar10;
              ((undefined8 *)(ONE + lVar11))[1] = uVar5;
              lVar14 = lVar14 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            lVar11 = lVar11 + 0x10;
          }
          break;
        case 0x46d7:
          puVar10 = (undefined8 *)(ONE + lStack_f0 * 0x10);
          lVar11 = 0;
          while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
            if (*(long *)(elems + lStack_f0 * 8) != 0) {
              puVar1 = (undefined8 *)((long)pvVar7 + lVar11 * 0x10);
              uVar5 = puVar1[1];
              *puVar10 = *puVar1;
              puVar10[1] = uVar5;
              lVar11 = lVar11 + 1;
            }
            lStack_f0 = lStack_f0 + 1;
            puVar10 = puVar10 + 2;
          }
          break;
        default:
          switch(lVar11) {
          case 0x4761:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              if (*(int *)(elems + lStack_f0 * 4) != 0) {
                *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4762:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              if (*(long *)(elems + lStack_f0 * 8) != 0) {
                *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4763:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              fVar3 = *(float *)(elems + lStack_f0 * 4);
              if ((fVar3 != 0.0) || (NAN(fVar3))) {
                *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4764:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              dVar4 = *(double *)(elems + lStack_f0 * 8);
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4766:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              fVar3 = *(float *)(elems + lStack_f0 * 8);
              if (((fVar3 != 0.0) ||
                  ((NAN(fVar3) || (fVar3 = *(float *)(elems + 4 + lStack_f0 * 8), fVar3 != 0.0))))
                 || (NAN(fVar3))) {
                *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
            break;
          case 0x4767:
            pdVar12 = (double *)(elems + lStack_f0 * 0x10 + 8);
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              if ((pdVar12[-1] != 0.0) ||
                 (((NAN(pdVar12[-1]) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))))) {
                *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
              pdVar12 = pdVar12 + 2;
            }
            break;
          case 0x4770:
            lVar11 = 0;
            while ((lStack_f0 <= lVar9 && (lVar11 < lVar8))) {
              if (*(long *)(elems + lStack_f0 * 8) != 0) {
                *(undefined8 *)(ONE + lStack_f0 * 8) = *(undefined8 *)((long)pvVar7 + lVar11 * 8);
                lVar11 = lVar11 + 1;
              }
              lStack_f0 = lStack_f0 + 1;
            }
          }
        }
      }
      pnga_release_update(local_b8,&lop,&hip);
    }
    pnga_free(pvVar7);
  }
  pnga_free(__s);
  pnga_sync();
  return;
}

Assistant:

static void sga_pack_unpack(Integer g_src, Integer g_dst, Integer g_msk,
                            Integer lo, Integer hi, Integer* icount,
                            Integer pack)
{
    void *ptr;
    long *lim=NULL;
    Integer nproc, me, i, myplace, np=0, first=-1;
    Integer lop, hip, dims;
    Integer ndim_src, ndim_dst, ndim_msk;
    Integer type_src, type_dst, type_msk;

    nproc = pnga_nnodes();
    me = pnga_nodeid();

    pnga_check_handle(g_src, "ga_pack src");
    pnga_check_handle(g_dst, "ga_pack dst");
    pnga_check_handle(g_msk, "ga_pack msk");
    pnga_inquire(g_src, &type_src, &ndim_src, &dims);
    pnga_inquire(g_dst, &type_dst, &ndim_dst, &dims);
    pnga_inquire(g_msk, &type_msk, &ndim_msk, &dims);
    if (1 != ndim_src) {
        pnga_error("ga_pack: supports 1-dim arrays only: src", ndim_src);
    }
    if (1 != ndim_dst) {
        pnga_error("ga_pack: supports 1-dim arrays only: dst", ndim_dst);
    }
    if (1 != ndim_msk) {
        pnga_error("ga_pack: supports 1-dim arrays only: msk", ndim_msk);
    }
    if (type_src != type_dst) {
        pnga_error("ga_pack: src and dst must be same type", 0);
    }
    if (1 == pack) {
        if(!pnga_compare_distr(g_src, g_msk)) {
            pnga_error("ga_pack: src and msk distributions differ",0);
        }
    } else if (0 == pack) {
        if(!pnga_compare_distr(g_dst, g_msk)) {
            pnga_error("ga_unpack: dst and msk distributions differ",0);
        }
    } else {
        pnga_error("ga_pack/unpack bad pack flag",0);
    }

    pnga_sync();

    lim = (long*) pnga_malloc(nproc, MT_C_LONGINT, "ga_pack lim buf");
    bzero(lim,sizeof(long)*nproc);
    pnga_distribution(g_msk, me, &lop, &hip);

    /* how many elements do we have to copy? */
    if ( lop > 0 ){ /* we get 0 if no elements stored on this process */
        Integer lop_1 = lop-1;
        /* adjust the range of elements to be within <lo,hi> */
        if(lop < lo) lop = lo;
        if(hip > hi) hip = hi;
        if(hi <lop || hip <lo); /* we have no elements to update */
        else{
            Integer elems, ONE=1;
            pnga_locate_nnodes(g_msk, &ONE, &lop_1, &np);
            pnga_access_ptr(g_msk, &lop, &hip, &ptr, &elems);
            elems = hip-lop+1;
            switch (type_msk) {
#define TYPE_CASE(MT,T,AT) case MT:                                         \
                {                                                           \
                    T * restrict aptr = (T*)ptr;                            \
                    for (i=0; i<elems; i++) {                               \
                        if (neq_zero_##AT(aptr[i])) {                       \
                            if (first<0) first=i;                           \
                            lim[np]++;                                      \
                        }                                                   \
                    }                                                       \
                    break;                                                  \
                }
#include "types.xh"
#undef TYPE_CASE
            }
        }
    }

    /* find number of elements everybody else is contributing */
    pnga_gop(C_LONG,lim,nproc,"+");

    for(i= myplace= *icount= 0; i<nproc; i++){
        if(i<np) myplace += lim[i];
        *icount += lim[i];
    }

    if(hi<lop || hip<lo || lim[np]==0 ); /* we have no elements to update */
    else{
        Integer ignore;
        void *buf=NULL, *msk=NULL;
        buf = pnga_malloc(lim[np], type_dst, "ga pack buf");
        pnga_access_ptr(g_msk, &lop, &hip, &msk, &ignore);
        if (1 == pack) {
            void *src=NULL;
            Integer dst_lo=myplace+1, dst_hi=myplace+lim[np];
            pnga_access_ptr(g_src, &lop, &hip, &src, &ignore);
            sga_pack(first, lim[np], hip-lop+1,
                     type_src, type_msk, src, buf, msk);
            pnga_put(g_dst, &dst_lo, &dst_hi, buf, &ignore);
            pnga_release(g_src, &lop, &hip);
        } else if (0 == pack) {
            void *dst=NULL;
            Integer src_lo=myplace+1, src_hi=myplace+lim[np];
            pnga_access_ptr(g_dst, &lop, &hip, &dst, &ignore);
            pnga_get(g_src, &src_lo, &src_hi, buf, &ignore);
            sga_unpack(first, lim[np], hip-lop+1,
                       type_src, type_msk, buf, dst, msk);
            pnga_release_update(g_dst, &lop, &hip);
        }
        pnga_free(buf);
    }
    pnga_free(lim);
    pnga_sync();
}